

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

ModelPackageItemInfo __thiscall
MPL::detail::ModelPackageImpl::createFile
          (ModelPackageImpl *this,string *name,string *author,string *description)

{
  char cVar1;
  runtime_error *prVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModelPackageImpl *this_00;
  string *in_R8;
  ModelPackageItemInfo MVar3;
  undefined1 local_2c0 [32];
  string identifier;
  path dstPath;
  path filePath;
  ofstream stream;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228 [63];
  
  this_00 = (ModelPackageImpl *)name;
  findItem((ModelPackageImpl *)&stream,name,author);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_228);
  if (_stream != (pointer)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&dstPath._M_pathname,"The package already contains a file with name: ",author);
    std::operator+(&filePath._M_pathname,&dstPath._M_pathname," author: ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stream,
                   &filePath._M_pathname,description);
    std::runtime_error::runtime_error(prVar2,(string *)&stream);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  getItemPath(&filePath,this_00,author,description);
  std::filesystem::__cxx11::operator/(&dstPath,(path *)&name[2].field_2,&filePath);
  std::filesystem::__cxx11::path::parent_path();
  std::filesystem::create_directories((path *)&stream);
  std::filesystem::__cxx11::path::~path((path *)&stream);
  std::ofstream::ofstream(&stream,dstPath._M_pathname._M_dataplus._M_p,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    generateIdentifier_abi_cxx11_
              (&identifier,(ModelPackageImpl *)dstPath._M_pathname._M_dataplus._M_p);
    std::filesystem::__cxx11::path::string((string *)local_2c0,&filePath);
    createItemInfoEntry((ModelPackageImpl *)name,&identifier,(string *)local_2c0,author,description,
                        in_R8);
    std::__cxx11::string::~string((string *)local_2c0);
    findItem((ModelPackageImpl *)local_2c0,name);
    std::__shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2> *)
                 this,(__shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>
                       *)local_2c0._0_8_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2c0 + 8));
    std::__cxx11::string::~string((string *)&identifier);
    std::ofstream::~ofstream(&stream);
    std::filesystem::__cxx11::path::~path(&dstPath);
    std::filesystem::__cxx11::path::~path(&filePath);
    MVar3.m_modelPackageItemInfoImpl.
    super___shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    MVar3.m_modelPackageItemInfoImpl.
    super___shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (ModelPackageItemInfo)
           MVar3.m_modelPackageItemInfoImpl.
           super___shared_ptr<MPL::detail::ModelPackageItemInfoImpl,_(__gnu_cxx::_Lock_policy)2>;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::filesystem::__cxx11::path::string((string *)local_2c0,&dstPath);
  std::operator+(&identifier,"Failed to create file at path: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
  std::runtime_error::runtime_error(prVar2,(string *)&identifier);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ModelPackageItemInfo ModelPackageImpl::createFile(const std::string& name, const std::string& author, const std::string& description) {
    
    if (findItem(name, author) != nullptr) {
        throw std::runtime_error("The package already contains a file with name: " + name + " author: " + author);
    }
    
    auto filePath = getItemPath(name, author);
    auto dstPath = m_packageDataDirPath / filePath;
    
    create_directories(dstPath.parent_path());
        
    std::ofstream stream(dstPath, std::ios::binary);
    if (!stream.is_open()) {
        throw std::runtime_error("Failed to create file at path: " + dstPath.string());
    }
    
    auto identifier = generateIdentifier();
    createItemInfoEntry(identifier, filePath.string(), name, author, description);
    return *(findItem(identifier));
}